

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

void __thiscall
icu_63::UnicodeString::UnicodeString(UnicodeString *this,int32_t capacity,UChar32 c,int32_t count)

{
  UBool UVar1;
  int len;
  char16_t *pcVar2;
  int local_58;
  int32_t i_1;
  UChar trail;
  UChar lead;
  UChar *array_1;
  int local_40;
  int32_t length_1;
  int32_t i;
  UChar unit;
  UChar *array;
  int32_t length;
  int32_t count_local;
  UChar32 c_local;
  int32_t capacity_local;
  UnicodeString *this_local;
  
  Replaceable::Replaceable(&this->super_Replaceable);
  (this->super_Replaceable).super_UObject._vptr_UObject = (_func_int **)&PTR__UnicodeString_005cbe70
  ;
  (this->fUnion).fStackFields.fLengthAndFlags = 0;
  if ((count < 1) || (0x10ffff < (uint)c)) {
    allocate(this,capacity);
  }
  else if (c < 0x10000) {
    count_local = capacity;
    if (capacity < count) {
      count_local = count;
    }
    UVar1 = allocate(this,count_local);
    if (UVar1 != '\0') {
      pcVar2 = getArrayStart(this);
      for (local_40 = 0; local_40 < count; local_40 = local_40 + 1) {
        pcVar2[local_40] = (char16_t)c;
      }
      setLength(this,count);
    }
  }
  else if (count < 0x40000000) {
    len = count << 1;
    count_local = capacity;
    if (capacity < len) {
      count_local = len;
    }
    UVar1 = allocate(this,count_local);
    if (UVar1 != '\0') {
      pcVar2 = getArrayStart(this);
      for (local_58 = 0; local_58 < len; local_58 = local_58 + 2) {
        pcVar2[local_58] = (short)(c >> 10) + L'ퟀ';
        pcVar2[local_58 + 1] = (char16_t)c & 0x3ffU | 0xdc00;
      }
      setLength(this,len);
    }
  }
  else {
    allocate(this,capacity);
  }
  return;
}

Assistant:

UnicodeString::UnicodeString(int32_t capacity, UChar32 c, int32_t count) {
  fUnion.fFields.fLengthAndFlags = 0;
  if(count <= 0 || (uint32_t)c > 0x10ffff) {
    // just allocate and do not do anything else
    allocate(capacity);
  } else if(c <= 0xffff) {
    int32_t length = count;
    if(capacity < length) {
      capacity = length;
    }
    if(allocate(capacity)) {
      UChar *array = getArrayStart();
      UChar unit = (UChar)c;
      for(int32_t i = 0; i < length; ++i) {
        array[i] = unit;
      }
      setLength(length);
    }
  } else {  // supplementary code point, write surrogate pairs
    if(count > (INT32_MAX / 2)) {
      // We would get more than 2G UChars.
      allocate(capacity);
      return;
    }
    int32_t length = count * 2;
    if(capacity < length) {
      capacity = length;
    }
    if(allocate(capacity)) {
      UChar *array = getArrayStart();
      UChar lead = U16_LEAD(c);
      UChar trail = U16_TRAIL(c);
      for(int32_t i = 0; i < length; i += 2) {
        array[i] = lead;
        array[i + 1] = trail;
      }
      setLength(length);
    }
  }
}